

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::GetPropertyObjectForElementAccess
               (Var instance,Var index,ScriptContext *scriptContext,
               RecyclableObject **propertyObject,rtErrors error)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptString *varName;
  
  BVar3 = GetPropertyObject(instance,scriptContext,propertyObject);
  if (*propertyObject != (RecyclableObject *)instance) {
    bVar2 = TaggedNumber::Is(instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x82b,
                                  "(*propertyObject == instance || TaggedNumber::Is(instance))",
                                  "*propertyObject == instance || TaggedNumber::Is(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if (BVar3 == 0) {
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar2) {
      varName = GetPropertyDisplayNameForError(index,scriptContext);
      JavascriptError::ThrowTypeError(scriptContext,error,varName);
    }
  }
  return SUB41(BVar3,0);
}

Assistant:

bool JavascriptOperators::GetPropertyObjectForElementAccess(
        _In_ Var instance,
        _In_ Var index,
        _In_ ScriptContext* scriptContext,
        _Out_ RecyclableObject** propertyObject,
        _In_ rtErrors error)
    {
        BOOL isNullOrUndefined = !GetPropertyObject(instance, scriptContext, propertyObject);
        Assert(*propertyObject == instance || TaggedNumber::Is(instance));

        if (isNullOrUndefined)
        {
            if (!scriptContext->GetThreadContext()->RecordImplicitException())
            {
                return false;
            }

            JavascriptError::ThrowTypeError(scriptContext, error, GetPropertyDisplayNameForError(index, scriptContext));
        }
        return true;
    }